

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O1

QAccessibleInterface * __thiscall QAccessibleWidget::focusChild(QAccessibleWidget *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QWidget *pQVar3;
  QAccessibleInterface *pQVar4;
  long lVar5;
  QWidget *pQVar6;
  
  pQVar2 = (QWidget *)(**(code **)(*(long *)this + 0x18))();
  pQVar3 = (QWidget *)0x0;
  if ((*(byte *)(*(long *)&pQVar2->field_0x8 + 0x30) & 1) != 0) {
    pQVar3 = pQVar2;
  }
  bVar1 = QWidget::hasFocus(pQVar3);
  pQVar3 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
  if (bVar1) {
    pQVar4 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface((QObject *)pQVar3);
    return pQVar4;
  }
  pQVar2 = (QWidget *)0x0;
  if ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x30) & 1) == 0) {
    pQVar3 = pQVar2;
  }
  pQVar3 = QWidget::focusWidget(pQVar3);
  if (pQVar3 != (QWidget *)0x0) {
    pQVar2 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
    if (pQVar2 == (QWidget *)0x0) {
      pQVar6 = (QWidget *)0x0;
    }
    else {
      pQVar6 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)&pQVar2->field_0x8 + 0x30) & 1) != 0) {
        pQVar6 = pQVar2;
      }
    }
    pQVar2 = pQVar3;
    if (pQVar3 != pQVar6) {
      do {
        pQVar2 = *(QWidget **)(*(long *)&pQVar2->field_0x8 + 0x10);
        if (pQVar2 == pQVar6) break;
      } while (pQVar2 != (QWidget *)0x0);
      if (pQVar2 == (QWidget *)0x0) {
        return (QAccessibleInterface *)0x0;
      }
    }
    pQVar2 = (QWidget *)QAccessible::queryAccessibleInterface(&pQVar3->super_QObject);
    if ((pQVar2 != (QWidget *)this && pQVar2 != (QWidget *)0x0) &&
       (lVar5 = (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2), lVar5 != 0)) {
      pQVar4 = (QAccessibleInterface *)(**(code **)(*(long *)pQVar2 + 0x30))(pQVar2);
      return pQVar4;
    }
  }
  return (QAccessibleInterface *)pQVar2;
}

Assistant:

QAccessibleInterface *QAccessibleWidget::focusChild() const
{
    if (widget()->hasFocus())
        return QAccessible::queryAccessibleInterface(object());

    QWidget *fw = widget()->focusWidget();
    if (!fw)
        return nullptr;

    if (isAncestor(widget(), fw)) {
        QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(fw);
        if (!iface || iface == this || !iface->focusChild())
            return iface;
        return iface->focusChild();
    }
    return nullptr;
}